

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O1

void mk_http_session_remove(mk_http_session *cs,mk_server *server)

{
  mk_list *pmVar1;
  mk_list *pmVar2;
  mk_list *pmVar3;
  mk_list *pmVar4;
  
  if (cs->_sched_init != 0) {
    pmVar2 = (cs->request_list).next;
    while (pmVar4 = pmVar2, pmVar4 != &cs->request_list) {
      pmVar1 = pmVar4[-7].next;
      pmVar2 = pmVar4->next;
      if (pmVar1 != (mk_list *)0x0) {
        pmVar3 = pmVar1[5].next[2].prev;
        if (pmVar3 == (mk_list *)0x0) {
          mk_print(0x1002,"Plugin %s, do not implement stage30_hangup",pmVar1[1].prev);
        }
        else {
          (*(code *)pmVar3)(pmVar1,cs,&pmVar4[-0x3f].next);
        }
      }
    }
    if (cs->body != cs->body_fixed) {
      free(cs->body);
    }
    mk_http_request_free_list(cs,server);
    pmVar2 = (cs->request_list).prev;
    pmVar4 = (cs->request_list).next;
    pmVar2->next = pmVar4;
    pmVar4->prev = pmVar2;
    (cs->request_list).prev = (mk_list *)0x0;
    (cs->request_list).next = (mk_list *)0x0;
    cs->_sched_init = 0;
  }
  return;
}

Assistant:

void mk_http_session_remove(struct mk_http_session *cs,
                            struct mk_server *server)
{
    struct mk_list *tmp;
    struct mk_list *head;
    struct mk_plugin *handler;
    struct mk_http_request *sr;

    MK_TRACE("[FD %i] HTTP Session remove", cs->socket);
    if (cs->_sched_init == MK_FALSE) {
        return;
    }

    /* On session remove, make sure to cleanup any handler */
    mk_list_foreach_safe(head, tmp, &cs->request_list) {
        sr = mk_list_entry(head, struct mk_http_request, _head);
        if (sr->stage30_handler) {
            MK_TRACE("Hangup stage30 handler");
            handler = sr->stage30_handler;
            if (mk_unlikely(!handler->stage->stage30_hangup)) {
                mk_warn("Plugin %s, do not implement stage30_hangup", handler->name);
                continue;
            }
            handler->stage->stage30_hangup(handler, cs, sr);
        }
    }

    if (cs->body != cs->body_fixed) {
        mk_mem_free(cs->body);
    }
    mk_http_request_free_list(cs, server);
    mk_list_del(&cs->request_list);

    cs->_sched_init = MK_FALSE;
}